

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,PackedArrayType *type,string_view param_3)

{
  bool bVar1;
  iterator pCVar2;
  PackedArrayType *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  ConstantRange *range;
  iterator __end2;
  iterator __begin2;
  SmallVector<slang::ConstantRange,_8UL> *__range2;
  PackedArrayType *curr;
  SmallVector<slang::ConstantRange,_8UL> dims;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_00000560;
  TypePrinter *in_stack_00000568;
  Symbol *in_stack_00000570;
  ConstantRange *in_stack_ffffffffffffff08;
  PackedArrayType *in_stack_ffffffffffffff10;
  iterator local_b0;
  SmallVectorBase<slang::ConstantRange> *this_00;
  string_view in_stack_ffffffffffffff70;
  PackedArrayType *local_80;
  SmallVectorBase<slang::ConstantRange> local_78 [2];
  PackedArrayType *local_20;
  
  local_20 = in_RSI;
  SmallVector<slang::ConstantRange,_8UL>::SmallVector
            ((SmallVector<slang::ConstantRange,_8UL> *)0x9ff7c1);
  local_80 = local_20;
  while( true ) {
    SmallVectorBase<slang::ConstantRange>::push_back
              ((SmallVectorBase<slang::ConstantRange> *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
    bVar1 = Type::isPackedArray((Type *)0x9ff7f6);
    if (!bVar1) break;
    Type::getCanonicalType((Type *)in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff10 = Symbol::as<slang::ast::PackedArrayType>((Symbol *)0x9ff847);
    local_80 = in_stack_ffffffffffffff10;
  }
  bVar3 = sv((char *)in_stack_ffffffffffffff10,(size_t)local_80->elementType);
  Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
            (in_stack_00000570,in_stack_00000568,in_stack_00000560);
  this_00 = local_78;
  local_b0 = SmallVectorBase<slang::ConstantRange>::begin(this_00);
  pCVar2 = SmallVectorBase<slang::ConstantRange>::end(this_00);
  for (; local_b0 != pCVar2; local_b0 = local_b0 + 1) {
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0x9ff8e8);
    FormatBuffer::format<int&,int&>
              ((FormatBuffer *)bVar3._M_str,(format_string<int_&,_int_&>)in_stack_ffffffffffffff70,
               (int *)bVar3._M_len,(int *)this_00);
  }
  SmallVector<slang::ConstantRange,_8UL>::~SmallVector
            ((SmallVector<slang::ConstantRange,_8UL> *)0x9ff93c);
  return;
}

Assistant:

void TypePrinter::visit(const PackedArrayType& type, std::string_view) {
    SmallVector<ConstantRange, 8> dims;
    const PackedArrayType* curr = &type;
    while (true) {
        dims.push_back(curr->range);
        if (!curr->elementType.isPackedArray())
            break;

        curr = &curr->elementType.getCanonicalType().as<PackedArrayType>();
    }

    curr->elementType.visit(*this, ""sv);
    for (auto& range : dims)
        buffer->format("[{}:{}]", range.left, range.right);
}